

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strategy.cpp
# Opt level: O0

void __thiscall Strategy::Strategy(Strategy *this,StrategyConfig *config)

{
  char *pcVar1;
  byte bVar2;
  CFGsContainer *pCVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator local_111;
  string local_110 [38];
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [38];
  undefined1 local_9a;
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [39];
  allocator local_49;
  string local_48 [48];
  StrategyConfig *local_18;
  StrategyConfig *config_local;
  Strategy *this_local;
  
  this->_vptr_Strategy = (_func_int **)&PTR__Strategy_0013bd10;
  local_18 = config;
  config_local = (StrategyConfig *)this;
  StrategyConfig::StrategyConfig(&this->m_config,config);
  this->m_a = (CFGsContainer *)0x0;
  this->m_b = (CFGsContainer *)0x0;
  std::ofstream::ofstream(&this->m_fout);
  if (local_18->instrs != (char *)0x0) {
    pcVar1 = local_18->instrs;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,pcVar1,&local_49);
    Instruction::load((string *)local_48);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  pCVar3 = (CFGsContainer *)operator_new(0x298);
  local_9a = 1;
  pcVar1 = local_18->input1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,pcVar1,&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"A",&local_99);
  CFGsContainer::CFGsContainer(pCVar3,(string *)local_70,(string *)local_98);
  local_9a = 0;
  this->m_a = pCVar3;
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  pCVar3 = (CFGsContainer *)operator_new(0x298);
  local_ea = 1;
  pcVar1 = local_18->input2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,pcVar1,&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"B",&local_e9);
  CFGsContainer::CFGsContainer(pCVar3,(string *)local_c0,(string *)local_e8);
  local_ea = 0;
  this->m_b = pCVar3;
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  if ((local_18->compress & 1U) != 0) {
    CFGsContainer::compressAll(this->m_a);
    CFGsContainer::compressAll(this->m_b);
  }
  CFGsContainer::checkAll(this->m_a);
  CFGsContainer::checkAll(this->m_b);
  if (local_18->dump != (char *)0x0) {
    CFGsContainer::dumpAll(this->m_a,local_18->dump);
    CFGsContainer::dumpAll(this->m_b,local_18->dump);
  }
  if (local_18->output != (char *)0x0) {
    std::ofstream::open((char *)&this->m_fout,(_Ios_Openmode)local_18->output);
    bVar2 = std::ofstream::is_open();
    if ((bVar2 & 1) == 0) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,"Unable to open output file: ",&local_111);
      std::operator+(__lhs,(char *)local_110);
      __cxa_throw(__lhs,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  return;
}

Assistant:

Strategy::Strategy(const StrategyConfig& config) : m_config(config), m_a(0), m_b(0) {
	if (config.instrs)
		Instruction::load(std::string(config.instrs));

	m_a = new CFGsContainer((std::string(config.input1)), "A");
	m_b = new CFGsContainer((std::string(config.input2)), "B");

	if (config.compress) {
		m_a->compressAll();
		m_b->compressAll();
	}

	m_a->checkAll();
	m_b->checkAll();

	if (config.dump) {
		m_a->dumpAll(config.dump);
		m_b->dumpAll(config.dump);
	}

	if (config.output) {
		m_fout.open(config.output);
		if (!m_fout.is_open())
			throw std::string("Unable to open output file: ") + config.output;
	}
}